

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

optional<pbrt::SpectrumHandle> pbrt::PiecewiseLinearSpectrum::Read(string *fn,Allocator alloc)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  PiecewiseLinearSpectrum *this;
  undefined8 extraout_RDX;
  aligned_storage_t<sizeof(pbrt::SpectrumHandle),_alignof(pbrt::SpectrumHandle)> in_RDI;
  optional<pbrt::SpectrumHandle> oVar4;
  string *in_stack_00000008;
  SpectrumHandle handle;
  size_t i;
  vector<float,_std::allocator<float>_> v;
  vector<float,_std::allocator<float>_> lambda;
  vector<float,_std::allocator<float>_> vals;
  PiecewiseLinearSpectrum *in_stack_ffffffffffffff38;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff40;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffff48;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  value_type in_stack_ffffffffffffff5c;
  aligned_storage_t<sizeof(pbrt::SpectrumHandle),_alignof(pbrt::SpectrumHandle)> args_3;
  float *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char *in_stack_ffffffffffffff90;
  vector<float,_std::allocator<float>_> local_30 [2];
  
  args_3 = in_RDI;
  ReadFloatFile(in_stack_00000008);
  bVar1 = std::vector<float,_std::allocator<float>_>::empty(in_stack_ffffffffffffff50);
  if (bVar1) {
    Warning<std::__cxx11::string_const&>
              ((char *)args_3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    memset((void *)in_RDI,0,0x10);
    pstd::optional<pbrt::SpectrumHandle>::optional((optional<pbrt::SpectrumHandle> *)in_RDI);
  }
  else {
    sVar2 = std::vector<float,_std::allocator<float>_>::size(local_30);
    if ((sVar2 & 1) == 0) {
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x53f3e0);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x53f3ea);
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      while( true ) {
        args = this_00;
        sVar2 = std::vector<float,_std::allocator<float>_>::size(local_30);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar2 >> 1) <=
            this_00) break;
        if (args != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](local_30,(long)args << 1);
          in_stack_ffffffffffffff5c = *pvVar3;
          pvVar3 = std::vector<float,_std::allocator<float>_>::back(in_stack_ffffffffffffff40);
          if (in_stack_ffffffffffffff5c <= *pvVar3) {
            uVar5 = SUB84(args,0);
            in_stack_ffffffffffffff50 =
                 (vector<float,_std::allocator<float>_> *)
                 std::vector<float,_std::allocator<float>_>::back(in_stack_ffffffffffffff40);
            std::vector<float,_std::allocator<float>_>::operator[](local_30,(long)args * 2);
            Warning<std::__cxx11::string_const&,int,float&,float&>
                      (in_stack_ffffffffffffff90,args,
                       (int *)CONCAT44(uVar5,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78,
                       (float *)args_3);
            memset((void *)in_RDI,0,0x10);
            pstd::optional<pbrt::SpectrumHandle>::optional((optional<pbrt::SpectrumHandle> *)in_RDI)
            ;
            goto LAB_0053f5c5;
          }
        }
        std::vector<float,_std::allocator<float>_>::operator[](local_30,(long)args * 2);
        std::vector<float,_std::allocator<float>_>::push_back
                  (in_stack_ffffffffffffff50,(value_type *)in_stack_ffffffffffffff48);
        std::vector<float,_std::allocator<float>_>::operator[](local_30,(long)args * 2 + 1);
        std::vector<float,_std::allocator<float>_>::push_back
                  (in_stack_ffffffffffffff50,(value_type *)in_stack_ffffffffffffff48);
        this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &args->field_0x1;
      }
      this = pstd::pmr::polymorphic_allocator<std::byte>::
             new_object<pbrt::PiecewiseLinearSpectrum,std::vector<float,std::allocator<float>>&,std::vector<float,std::allocator<float>>&,pstd::pmr::polymorphic_allocator<std::byte>&>
                       ((polymorphic_allocator<std::byte> *)this_00,
                        (vector<float,_std::allocator<float>_> *)
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                        in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      SpectrumHandle::TaggedPointer<pbrt::PiecewiseLinearSpectrum>
                ((SpectrumHandle *)this,in_stack_ffffffffffffff38);
      pstd::optional<pbrt::SpectrumHandle>::optional
                ((optional<pbrt::SpectrumHandle> *)this,(SpectrumHandle *)in_stack_ffffffffffffff38)
      ;
LAB_0053f5c5:
      std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffff50);
      std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffff50);
    }
    else {
      Warning<std::__cxx11::string_const&>
                ((char *)args_3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      memset((void *)in_RDI,0,0x10);
      pstd::optional<pbrt::SpectrumHandle>::optional((optional<pbrt::SpectrumHandle> *)in_RDI);
    }
  }
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffff50);
  oVar4._8_8_ = extraout_RDX;
  oVar4.optionalValue = args_3;
  return oVar4;
}

Assistant:

pstd::optional<SpectrumHandle> PiecewiseLinearSpectrum::Read(const std::string &fn,
                                                             Allocator alloc) {
    std::vector<Float> vals = ReadFloatFile(fn);
    if (vals.empty()) {
        Warning("%s: unable to read spectrum file.", fn);
        return {};
    } else {
        if (vals.size() % 2 != 0) {
            Warning("%s: extra value found in spectrum file.", fn);
            return {};
        }
        std::vector<Float> lambda, v;
        for (size_t i = 0; i < vals.size() / 2; ++i) {
            if (i > 0 && vals[2 * i] <= lambda.back()) {
                Warning("%s: spectrum file invalid: at %d'th entry, "
                        "wavelengths aren't "
                        "increasing: %f >= %f.",
                        fn, int(i), lambda.back(), vals[2 * i]);
                return {};
            }
            lambda.push_back(vals[2 * i]);
            v.push_back(vals[2 * i + 1]);
        }
        SpectrumHandle handle =
            alloc.new_object<PiecewiseLinearSpectrum>(lambda, v, alloc);
        return handle;
    }
}